

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

void __thiscall duckdb::LogManager::SetEnableLogging(LogManager *this,bool enable)

{
  pointer pLVar1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_20,&this->lock);
  (this->config).enabled = enable;
  pLVar1 = unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::operator->
                     (&this->global_logger);
  (*pLVar1->_vptr_Logger[7])(pLVar1,&this->config);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void LogManager::SetEnableLogging(bool enable) {
	unique_lock<mutex> lck(lock);
	config.enabled = enable;
	global_logger->UpdateConfig(config);
}